

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,ArgumentDirection direction,
          DataTypeSyntax *type,NetType *netType,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  string_view *args;
  ArgumentDirection AVar1;
  EqualsValueClauseSyntax *this_00;
  Scope *this_01;
  ExpressionSyntax *pEVar2;
  DataTypeSyntax *pDVar3;
  size_t sVar4;
  PortSymbol *this_02;
  Diagnostic *this_03;
  Symbol *pSVar5;
  SourceLocation SVar6;
  DiagCode code;
  pointer in_R9;
  SourceLocation *args_1;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  PortSymbol *port;
  bool local_61;
  Compilation *local_60;
  SourceLocation local_58;
  pointer local_50;
  DataTypeSyntax *local_48;
  string_view local_40;
  
  local_60 = this->comp;
  local_50 = in_R9;
  local_48 = type;
  local_40 = parsing::Token::valueText(&decl->name);
  local_58 = parsing::Token::location(&decl->name);
  local_61 = true;
  this_02 = BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                      (&local_60->super_BumpAllocator,&local_40,&local_58,&local_61);
  local_40._M_len = (size_t)this_02;
  this_02->direction = direction;
  (this_02->super_Symbol).originatingSyntax = &decl->super_SyntaxNode;
  syntax._M_extent._M_extent_value = (size_t)attrs._M_ptr;
  syntax._M_ptr = local_50;
  local_60 = (Compilation *)decl;
  Symbol::setAttributes(&this_02->super_Symbol,this->scope,syntax);
  if ((this_02->super_Symbol).name._M_len == 0) goto LAB_0027f1ef;
  AVar1 = this_02->direction;
  code.subsystem = Declarations;
  code.code = 0x49;
  if (netType == (NetType *)0x0 && AVar1 == InOut) {
LAB_0027f1d2:
    this_03 = Scope::addDiag(this->scope,code,(this_02->super_Symbol).location);
    Diagnostic::operator<<(this_03,(this_02->super_Symbol).name);
  }
  else if (AVar1 == InOut) {
    code.subsystem = Declarations;
    code.code = 0x4a;
    if (netType->netKind == UWire) goto LAB_0027f1d2;
  }
  else {
    code.subsystem = Declarations;
    code.code = 0xbc;
    if (AVar1 == Ref && netType != (NetType *)0x0) goto LAB_0027f1d2;
  }
LAB_0027f1ef:
  if (((((this->comp->options).flags.m_bits & 0x2000) != 0) &&
      (pSVar5 = Scope::find(this->scope,(this_02->super_Symbol).name), pSVar5 != (Symbol *)0x0)) &&
     (pSVar5->kind - Net < 2)) {
    this_02->internalSymbol = pSVar5;
  }
  pDVar3 = local_48;
  if (this_02->internalSymbol != (Symbol *)0x0) goto LAB_0027f2e1;
  args = &(this_02->super_Symbol).name;
  args_1 = &(this_02->super_Symbol).location;
  if (netType == (NetType *)0x0) {
    local_58._0_4_ = 1;
    local_58 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                         (&this->comp->super_BumpAllocator,args,args_1,(VariableLifetime *)&local_58
                         );
  }
  else {
    local_58 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                         (&this->comp->super_BumpAllocator,args,args_1,netType);
  }
  if (pDVar3 == (DataTypeSyntax *)0x0) {
    if ((((SyntaxList<slang::syntax::VariableDimensionSyntax> *)((long)local_60 + 0x28))->
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)._M_extent.
        _M_extent_value != 0) goto LAB_0027f295;
  }
  else {
    *(DataTypeSyntax **)((long)local_58 + 0x50) = pDVar3;
    *(byte *)((long)local_58 + 0x7f) = *(byte *)((long)local_58 + 0x7f) & 0x7f;
LAB_0027f295:
    DeclaredType::setDimensionSyntax
              ((DeclaredType *)((long)local_58 + 0x40),
               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)((long)local_60 + 0x28));
  }
  SVar6 = local_58;
  *(Compilation **)((long)local_58 + 0x38) = local_60;
  syntax_00._M_extent._M_extent_value = (size_t)attrs._M_ptr;
  syntax_00._M_ptr = local_50;
  Symbol::setAttributes((Symbol *)local_58,this->scope,syntax_00);
  *(SourceLocation *)(local_40._M_len + 0x40) = SVar6;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
  emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
            ((SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
             this->implicitMembers,(ValueSymbol **)&local_58,(PortSymbol **)&local_40);
LAB_0027f2e1:
  sVar4 = local_40._M_len;
  this_00 = *(EqualsValueClauseSyntax **)((long)local_60 + 0x60);
  if (this_00 != (EqualsValueClauseSyntax *)0x0) {
    if ((netType == (NetType *)0x0) || (netType->netKind != Interconnect)) {
      pEVar2 = (this_00->expr).ptr;
      SVar6 = parsing::Token::location(&this_00->equals);
      *(ExpressionSyntax **)&((Symbol *)(sVar4 + 0x40))->indexInScope = pEVar2;
      ((Symbol *)(sVar4 + 0x40))->originatingSyntax = (SyntaxNode *)SVar6;
    }
    else {
      this_01 = this->scope;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
      Scope::addDiag(this_01,(DiagCode)0x650005,sourceRange);
    }
  }
  this->lastDirection = direction;
  this->lastType = pDVar3;
  this->lastNetType = netType;
  this->lastInterface = (DefinitionSymbol *)0x0;
  (this->lastModport)._M_len = 0;
  (this->lastModport)._M_str = "";
  this->lastGenericIface = false;
  return (Symbol *)local_40._M_len;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, ArgumentDirection direction,
                const DataTypeSyntax* type, const NetType* netType,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<PortSymbol>(decl.name.valueText(), decl.name.location(),
                                             /* isAnsiPort */ true);
        port->direction = direction;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (!port->name.empty()) {
            if (port->direction == ArgumentDirection::InOut && !netType) {
                scope.addDiag(diag::InOutPortCannotBeVariable, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::InOut &&
                     netType->netKind == NetType::UWire) {
                scope.addDiag(diag::InOutUWirePort, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::Ref && netType) {
                scope.addDiag(diag::RefPortMustBeVariable, port->location) << port->name;
            }
        }

        // Support a compatibility option which allows ANSI ports to still look
        // up and connect to an identically named net or variable declared in
        // the definition body instead of creating a new symbol internally.
        if (comp.hasFlag(CompilationFlags::AllowMergingAnsiPorts)) {
            if (auto symbol = scope.find(port->name);
                symbol &&
                (symbol->kind == SymbolKind::Variable || symbol->kind == SymbolKind::Net)) {
                port->internalSymbol = symbol;
            }
        }

        // Create a new symbol to represent this port internally to the instance.
        if (!port->internalSymbol) {
            ValueSymbol* symbol;
            if (netType) {
                symbol = comp.emplace<NetSymbol>(port->name, port->location, *netType);
            }
            else {
                symbol = comp.emplace<VariableSymbol>(port->name, port->location,
                                                      VariableLifetime::Static);
            }

            if (type) {
                symbol->setDeclaredType(*type, decl.dimensions);
            }
            else {
                SLANG_ASSERT(netType);
                if (!decl.dimensions.empty())
                    symbol->getDeclaredType()->setDimensionSyntax(decl.dimensions);
            }

            symbol->setSyntax(decl);
            symbol->setAttributes(scope, attrs);
            port->internalSymbol = symbol;
            implicitMembers.emplace_back(symbol, port);
        }

        if (decl.initializer) {
            if (netType && netType->netKind == NetType::Interconnect) {
                scope.addDiag(diag::InterconnectInitializer, decl.initializer->sourceRange());
            }
            else {
                port->setInitializerSyntax(*decl.initializer->expr,
                                           decl.initializer->equals.location());
            }
        }

        // Remember the properties of this port in case the next port wants to inherit from it.
        lastDirection = direction;
        lastType = type;
        lastNetType = netType;
        lastInterface = nullptr;
        lastModport = ""sv;
        lastGenericIface = false;

        return port;
    }